

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

bool __thiscall
icu_63::RBBITableBuilder::findDuplCharClassFrom(RBBITableBuilder *this,IntPair *categories)

{
  int32_t iVar1;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  RBBIStateDescriptor *sd;
  int32_t state;
  uint16_t table_dupl;
  uint16_t table_base;
  int32_t numCols;
  int32_t numStates;
  IntPair *categories_local;
  RBBITableBuilder *this_local;
  
  iVar1 = UVector::size(this->fDStates);
  iVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  do {
    if (iVar2 + -1 <= categories->first) {
      return false;
    }
    categories->second = categories->first + 1;
    while (categories->second < iVar2) {
      sd._6_2_ = 0;
      sd._4_2_ = 1;
      for (sd._0_4_ = 0; (int)sd < iVar1; sd._0_4_ = (int)sd + 1) {
        pvVar5 = UVector::elementAt(this->fDStates,(int)sd);
        uVar3 = UVector32::elementAti(*(UVector32 **)((long)pvVar5 + 0x28),categories->first);
        sd._6_2_ = (short)uVar3;
        uVar4 = UVector32::elementAti(*(UVector32 **)((long)pvVar5 + 0x28),categories->second);
        sd._4_2_ = (short)uVar4;
        if ((uVar3 & 0xffff) != (uVar4 & 0xffff)) break;
      }
      if (sd._6_2_ == sd._4_2_) {
        return true;
      }
      categories->second = categories->second + 1;
    }
    categories->first = categories->first + 1;
  } while( true );
}

Assistant:

bool RBBITableBuilder::findDuplCharClassFrom(IntPair *categories) {
    int32_t numStates = fDStates->size();
    int32_t numCols = fRB->fSetBuilder->getNumCharCategories();

    for (; categories->first < numCols-1; categories->first++) {
        for (categories->second=categories->first+1; categories->second < numCols; categories->second++) {
            // Initialized to different values to prevent returning true if numStates = 0 (implies no duplicates).
            uint16_t table_base = 0;
            uint16_t table_dupl = 1;
            for (int32_t state=0; state<numStates; state++) {
                RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
                table_base = (uint16_t)sd->fDtran->elementAti(categories->first);
                table_dupl = (uint16_t)sd->fDtran->elementAti(categories->second);
                if (table_base != table_dupl) {
                    break;
                }
            }
            if (table_base == table_dupl) {
                return true;
            }
        }
    }
    return false;
}